

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetBrDropKeepCount
          (BinaryReaderInterp *this,Index depth,Index *out_drop_count,Index *out_keep_count)

{
  Result RVar1;
  TypeVector *pTVar2;
  Enum EVar3;
  Index keep_count;
  Label *label;
  
  RVar1 = TypeChecker::GetLabel(&(this->validator_).typechecker_,depth,&label);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    pTVar2 = &label->result_types;
    if (label->label_type == Loop) {
      pTVar2 = &label->param_types;
    }
    keep_count = (Index)((ulong)((long)(pTVar2->
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pTVar2->
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 3);
    RVar1 = GetDropCount(this,keep_count,label->type_stack_limit,out_drop_count);
    if (RVar1.enum_ != Error) {
      *out_keep_count = keep_count;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::GetBrDropKeepCount(Index depth,
                                              Index* out_drop_count,
                                              Index* out_keep_count) {
  SharedValidator::Label* label;
  CHECK_RESULT(validator_.GetLabel(depth, &label));
  Index keep_count = label->br_types().size();
  CHECK_RESULT(
      GetDropCount(keep_count, label->type_stack_limit, out_drop_count));
  *out_keep_count = keep_count;
  return Result::Ok;
}